

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dead_code_elimination.cpp
# Opt level: O2

void __thiscall mocker::DeadCodeElimination::mark(DeadCodeElimination *this)

{
  _func_int **pp_Var1;
  pointer psVar2;
  bool bVar3;
  mapped_type *pmVar4;
  __shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2> *p_Var5;
  LabelSet *pLVar6;
  FunctionModule *in_RDX;
  pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_> *option;
  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *this_00;
  _func_int **pp_Var7;
  element_type *peVar8;
  __node_base *p_Var9;
  shared_ptr<mocker::ir::Phi> phi;
  value_type inst;
  mapped_type defingInst;
  shared_ptr<mocker::ir::Reg> reg;
  anon_class_8_1_8991fb9c markUsefulBB;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::IRInst>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::IRInst>_>_>_>
  instDefine;
  element_type *local_e8;
  vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
  local_e0;
  __shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2> local_c8;
  deque<std::shared_ptr<mocker::ir::IRInst>,std::allocator<std::shared_ptr<mocker::ir::IRInst>>>
  *local_b8;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_b0;
  __shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2> local_a8;
  shared_ptr<mocker::ir::Addr> local_98;
  DominatorTree *local_88;
  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_80;
  _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *local_78;
  anon_class_8_1_8991fb9c local_70;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::IRInst>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::IRInst>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68;
  
  buildInstDefine_abi_cxx11_
            ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::IRInst>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::IRInst>_>_>_>
              *)&local_68,(mocker *)(this->super_FuncPass).func,in_RDX);
  local_b8 = (deque<std::shared_ptr<mocker::ir::IRInst>,std::allocator<std::shared_ptr<mocker::ir::IRInst>>>
              *)&this->worklist;
  this_00 = (_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             *)&this->residingBB;
  local_78 = (_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)&this->usefulBB;
  local_b0 = &(this->useful)._M_h;
  local_88 = &this->rdt;
  local_80 = this_00;
  local_70.this = this;
  while (p_Var5 = &((this->worklist).c.
                    super__Deque_base<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur)->
                   super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>,
        &((this->worklist).c.
          super__Deque_base<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur)->
         super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2> != p_Var5) {
    std::__shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_c8,p_Var5);
    std::
    deque<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
    ::pop_front((deque<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
                 *)local_b8);
    local_e0.
    super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_c8._M_ptr;
    pmVar4 = std::__detail::
             _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::at(this_00,(key_type *)&local_e0);
    std::
    _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::_M_emplace<unsigned_long&>(local_78,pmVar4);
    ir::getOperandsUsed(&local_e0,(shared_ptr<mocker::ir::IRInst> *)&local_c8);
    psVar2 = local_e0.
             super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (peVar8 = (element_type *)
                  local_e0.
                  super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; peVar8 != (element_type *)psVar2;
        peVar8 = peVar8 + 1) {
      ir::dycLocalReg(&local_98);
      if (local_98.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(local_98.
                                  super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_ptr + 1),".phi_nan");
        if (!bVar3) {
          bVar3 = isParameter(this,(string *)
                                   (local_98.
                                    super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr + 1));
          if (!bVar3) {
            p_Var5 = &std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::IRInst>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::IRInst>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::IRInst>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::IRInst>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&local_68,
                           (key_type *)
                           (local_98.
                            super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                           + 1))->super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>
            ;
            std::__shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      (&local_a8,p_Var5);
            local_e8 = local_a8._M_ptr;
            bVar3 = isIn<std::unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>,unsigned_long>
                              ((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                                *)local_b0,(unsigned_long *)&local_e8);
            if (!bVar3) {
              local_e8 = local_a8._M_ptr;
              std::
              _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::_M_emplace<unsigned_long>(local_b0,&local_e8);
              std::
              deque<std::shared_ptr<mocker::ir::IRInst>,std::allocator<std::shared_ptr<mocker::ir::IRInst>>>
              ::emplace_back<std::shared_ptr<mocker::ir::IRInst>&>
                        (local_b8,(shared_ptr<mocker::ir::IRInst> *)&local_a8);
            }
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a8._M_refcount);
          }
        }
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_98.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    std::
    vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>::
    ~vector(&local_e0);
    ir::dyc<mocker::ir::Phi,std::shared_ptr<mocker::ir::IRInst>&>
              ((ir *)&local_e0,(shared_ptr<mocker::ir::IRInst> *)&local_c8);
    if ((element_type *)
        local_e0.
        super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (element_type *)0x0) {
      pp_Var1 = ((element_type *)
                (local_e0.
                 super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 3))->_vptr_IRInst;
      for (pp_Var7 = *(_func_int ***)
                      &((element_type *)
                       (local_e0.
                        super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + 2))->type; pp_Var7 != pp_Var1;
          pp_Var7 = pp_Var7 + 4) {
        mark::anon_class_8_1_8991fb9c::operator()(&local_70,*(size_t *)(pp_Var7[2] + 8));
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_e0.
                super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                ._M_impl.super__Vector_impl_data._M_finish);
    this_00 = local_80;
    local_e0.
    super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_c8._M_ptr;
    pmVar4 = std::__detail::
             _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::at(local_80,(key_type *)&local_e0);
    pLVar6 = DominatorTree::getDominanceFrontier(local_88,*pmVar4);
    p_Var9 = &(pLVar6->_M_h)._M_before_begin;
    while (p_Var9 = p_Var9->_M_nxt, p_Var9 != (__node_base *)0x0) {
      mark::anon_class_8_1_8991fb9c::operator()(&local_70,(size_t)p_Var9[1]._M_nxt);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c8._M_refcount);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::IRInst>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::IRInst>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_68);
  return;
}

Assistant:

void DeadCodeElimination::mark() {
  std::unordered_map<std::string, std::shared_ptr<ir::IRInst>> instDefine =
      buildInstDefine(func);

  auto markUsefulBB = [this](std::size_t label) {
    auto &bb = func.getBasicBlock(label);
    auto terminator = bb.getInsts().back();
    if (isIn(useful, terminator->getID()))
      return;
    useful.emplace(terminator->getID());
    worklist.emplace(terminator);
  };

  while (!worklist.empty()) {
    auto inst = worklist.front();
    worklist.pop();
    usefulBB.emplace(residingBB.at(inst->getID()));
    for (auto &operand : ir::getOperandsUsed(inst)) {
      auto reg = ir::dycLocalReg(operand);
      if (!reg || reg->getIdentifier() == ".phi_nan" ||
          isParameter(reg->getIdentifier()))
        continue;
      auto defingInst = instDefine.at(reg->getIdentifier());
      if (isIn(useful, defingInst->getID()))
        continue;
      useful.emplace(defingInst->getID());
      worklist.emplace(defingInst);
    }
    if (auto phi = ir::dyc<ir::Phi>(inst)) {
      for (auto &option : phi->getOptions()) {
        auto label = option.second->getID();
        markUsefulBB(label);
      }
    }

    auto curBB = residingBB.at(inst->getID());
    for (auto label : rdt.getDominanceFrontier(curBB)) {
      markUsefulBB(label);
    }
  }
}